

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_unpolar_impl
               (double rho,double sigma,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  dVar1 = cbrt(rho);
  dVar4 = 2.4814019635975995 / dVar1;
  dVar5 = SQRT(dVar4);
  dVar2 = dVar5;
  if (dVar4 < 0.0) {
    dVar2 = sqrt(dVar4);
    dVar5 = sqrt(dVar4);
  }
  dVar5 = dVar5 * dVar5 * dVar5;
  dVar6 = 1.5393389262365056 / (dVar1 * dVar1);
  dVar3 = log(16.081979498692537 /
              (dVar6 * 0.123235 + dVar5 * 0.204775 + dVar2 * 3.79785 + dVar4 * 0.8969) + 1.0);
  dVar2 = log(29.608749977793437 /
              (dVar6 * 0.1241775 + dVar5 * 0.1100325 + dVar2 * 5.1785 + dVar4 * 0.905775) + 1.0);
  dVar5 = dVar2 * (dVar4 * 0.0278125 + 1.0) * 0.0 - dVar3 * (dVar4 * 0.053425 + 1.0) * 0.0621814;
  dVar2 = exp(dVar5 * -32.16396844291482);
  dVar4 = 1.0 / (dVar2 + -1.0);
  dVar2 = rho * rho;
  auVar8._8_8_ = dVar1 * dVar1;
  auVar8._0_8_ = dVar1;
  auVar8 = divpd(_DAT_010020a0,auVar8);
  auVar9._8_8_ = dVar2 * dVar2;
  auVar9._0_8_ = dVar2;
  auVar9 = divpd(auVar8,auVar9);
  auVar7._0_8_ = sigma * auVar9._0_8_ * 1.2599210498948732 * 4.83597586204941;
  auVar7._8_8_ = dVar4 * 32.16396844291482 * 0.06672455060314922 * sigma * sigma *
                 auVar9._8_8_ * 1.5874010519681996 * 7.795554179441513;
  auVar9 = divpd(auVar7,_DAT_010020e0);
  dVar2 = auVar9._8_8_ + auVar9._0_8_;
  dVar2 = log((1.0 / (dVar4 * 2.1461263399673647 * dVar2 + 1.0)) * 32.16396844291482 *
              dVar2 * 0.06672455060314922 + 1.0);
  *eps = dVar2 * 0.031090690869654894 + dVar5;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t39 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t18 = t1 * t1;
    constexpr double t19 = t3 * t3;
    constexpr double t20 = t18 * t19;
    constexpr double t70 = 0.1e1 / t3;
    constexpr double t75 = BB * beta;
    constexpr double t76 = 0.1e1 / gamma;
    constexpr double t91 = t39 * t39;
    constexpr double t96 = 0.1e1 / t19;
    constexpr double t97 = t1 * t96;
    constexpr double t98 = t97 * t6;
    constexpr double t104 = beta * t76;


    const double t7 = safe_math::cbrt( rho );
    const double t10 = t4 * t6 / t7;
    const double t12 = 0.1e1 + 0.53425e-1 * t10;
    const double t13 = safe_math::sqrt( t10 );
    const double t16 = pow_3_2( t10 );
    const double t21 = t7 * t7;
    const double t24 = t20 * t5 / t21;
    const double t26 = 0.379785e1 * t13 + 0.8969e0 * t10 + 0.204775e0 * t16 + 0.123235e0 * t24;
    const double t29 = 0.1e1 + 0.16081979498692535067e2 / t26;
    const double t30 = safe_math::log( t29 );
    const double t32 = 0.621814e-1 * t12 * t30;
    const double t33 = 0.1e1 <= zeta_tol;
    const double t34 = safe_math::cbrt( zeta_tol );
    const double t36 = piecewise_functor_3( t33, t34 * zeta_tol, 1.0 );
    const double t43 = ( 0.2e1 * t36 - 0.2e1 ) / ( 0.2e1 * t39 - 0.2e1 );
    const double t45 = 0.1e1 + 0.278125e-1 * t10;
    const double t50 = 0.51785e1 * t13 + 0.905775e0 * t10 + 0.1100325e0 * t16 + 0.1241775e0 * t24;
    const double t53 = 0.1e1 + 0.29608749977793437516e2 / t50;
    const double t54 = safe_math::log( t53 );
    const double t57 = 0.19751673498613801407e-1 * t43 * t45 * t54;
    const double t58 = t34 * t34;
    const double t59 = piecewise_functor_3( t33, t58, 1.0 );
    const double t60 = t59 * t59;
    const double t61 = t60 * t59;
    const double t62 = gamma * t61;
    const double t63 = rho * rho;
    const double t65 = 0.1e1 / t7 / t63;
    const double t68 = 0.1e1 / t60;
    const double t72 = t68 * t18 * t70 * t5;
    const double t79 = 0.1e1 / t61;
    const double t81 = safe_math::exp( -( -t32 + t57 ) * t76 * t79 );
    const double t82 = t81 - 0.1e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = sigma * sigma;
    const double t87 = t75 * t84 * t85;
    const double t88 = t63 * t63;
    const double t90 = 0.1e1 / t21 / t88;
    const double t92 = t90 * t91;
    const double t93 = t60 * t60;
    const double t94 = 0.1e1 / t93;
    const double t95 = t92 * t94;
    const double t99 = t95 * t98;
    const double t102 = sigma * t65 * t39 * t72 / 0.96e2 + t87 * t99 / 0.3072e4;
    const double t103 = beta * t102;
    const double t107 = t104 * t83 * t102 + 0.1e1;
    const double t108 = 0.1e1 / t107;
    const double t109 = t76 * t108;
    const double t111 = t103 * t109 + 0.1e1;
    const double t112 = safe_math::log( t111 );
    const double t113 = t62 * t112;


    eps = -t32 + t57 + t113;

  }